

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StreamMemory.cpp
# Opt level: O3

void __thiscall
Rml::StreamMemory::StreamMemory(StreamMemory *this,byte *_buffer,size_t _buffer_size)

{
  Stream::Stream(&this->super_Stream);
  (this->super_Stream)._vptr_Stream = (_func_int **)&PTR__StreamMemory_00331780;
  this->buffer = _buffer;
  this->buffer_size = _buffer_size;
  this->buffer_used = _buffer_size;
  this->owns_buffer = false;
  this->buffer_ptr = _buffer;
  return;
}

Assistant:

StreamMemory::StreamMemory(const byte* _buffer, size_t _buffer_size)
{
	buffer = (byte*)_buffer;
	buffer_size = _buffer_size;
	buffer_used = _buffer_size;
	owns_buffer = false;
	buffer_ptr = buffer;
}